

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

Addr * __thiscall hwnet::TCPSocket::LocalAddr(TCPSocket *this)

{
  Addr *__addr;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  Addr *pAVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  socklen_t local_24 [2];
  socklen_t len;
  
  bVar8 = 0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    __addr = &this->localAddr;
    if (2 < (this->localAddr).addrType - 1U) {
      local_24[0] = 0x78;
      iVar3 = getsockname(this->fd,(sockaddr *)__addr,local_24);
      if (iVar3 == 0) {
        local_98 = 0;
        uStack_90 = 0;
        uStack_8c = 0;
        local_88 = 0;
        uStack_84 = 0;
        uStack_80 = 0;
        uStack_7c = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        uStack_30 = 0;
        if (local_24[0] == 0x6e) {
          pAVar6 = __addr;
          puVar7 = &local_98;
          for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar7 = *(undefined8 *)&pAVar6->sockaddr;
            pAVar6 = (Addr *)((long)pAVar6 + (ulong)bVar8 * -0x10 + 8);
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          uStack_30 = CONCAT44(CONCAT22(uStack_30._6_2_,
                                        *(undefined2 *)((long)&(this->localAddr).sockaddr + 0x6c)),
                               *(undefined4 *)((long)&(this->localAddr).sockaddr + 0x68));
          iVar3 = 1;
          iVar5 = 3;
        }
        else if (local_24[0] == 0x1c) {
          uVar1 = *(undefined8 *)((long)&(this->localAddr).sockaddr + 8);
          uVar2 = *(undefined8 *)((long)&(this->localAddr).sockaddr + 0x14);
          local_88 = (undefined4)
                     ((ulong)*(undefined8 *)((long)&(this->localAddr).sockaddr + 0xc) >> 0x20);
          uStack_84 = (undefined4)uVar2;
          uStack_80 = (undefined4)((ulong)uVar2 >> 0x20);
          local_98 = *(undefined8 *)&__addr->sockaddr;
          uStack_90 = (undefined4)uVar1;
          uStack_8c = (undefined4)((ulong)uVar1 >> 0x20);
          iVar3 = 10;
          iVar5 = 2;
        }
        else {
          iVar5 = 0;
          iVar3 = 0;
          if (local_24[0] == 0x10) {
            uVar1 = *(undefined8 *)((long)&(this->localAddr).sockaddr + 8);
            local_98 = *(undefined8 *)&__addr->sockaddr;
            uStack_90 = (undefined4)uVar1;
            uStack_8c = (undefined4)((ulong)uVar1 >> 0x20);
            iVar3 = 2;
            iVar5 = 1;
          }
        }
        puVar7 = &local_98;
        pAVar6 = __addr;
        for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined8 *)&pAVar6->sockaddr = *puVar7;
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          pAVar6 = (Addr *)((long)pAVar6 + (ulong)bVar8 * -0x10 + 8);
        }
        (this->localAddr).addrType = iVar5;
        (this->localAddr).family = iVar3;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return __addr;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

const Addr& TCPSocket::LocalAddr() const {
	std::lock_guard<std::mutex> guard(this->mtx);	
	if(!this->localAddr.IsVaild()) {
		socklen_t len = sizeof(this->localAddr);
		if(0 == ::getsockname(this->fd,this->localAddr.Address(),&len)) {
			this->localAddr = Addr::MakeBySockAddr(this->localAddr.Address(),len);
		}		
	}
	return this->localAddr;	
}